

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  bool bVar1;
  Comparator *pCVar2;
  long in_RSI;
  VersionEdit *in_RDI;
  string record;
  Writer log;
  WritableFile *file;
  string manifest;
  VersionEdit new_db;
  Status *s;
  string *in_stack_fffffffffffffe78;
  Status *rhs;
  VersionEdit *this_00;
  Slice *in_stack_fffffffffffffe98;
  VersionEdit *in_stack_fffffffffffffea0;
  undefined1 local_158 [32];
  string local_138 [40];
  Slice *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  Status *local_f0;
  string local_e8 [32];
  string *in_stack_ffffffffffffff38;
  VersionEdit *in_stack_ffffffffffffff40;
  uint64_t in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  Env *in_stack_ffffffffffffff78;
  
  this_00 = in_RDI;
  VersionEdit::VersionEdit(in_RDI);
  pCVar2 = user_comparator((DBImpl *)0x10e988);
  (*pCVar2->_vptr_Comparator[3])();
  Slice::Slice((Slice *)this_00,(char *)in_stack_fffffffffffffe78);
  VersionEdit::SetComparatorName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  VersionEdit::SetLogNumber((VersionEdit *)&stack0xffffffffffffff48,0);
  VersionEdit::SetNextFile((VersionEdit *)&stack0xffffffffffffff48,2);
  VersionEdit::SetLastSequence((VersionEdit *)&stack0xffffffffffffff48,0);
  DescriptorFileName(in_stack_fffffffffffffef8,(uint64_t)in_stack_fffffffffffffef0);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(in_RDI,*(long **)(in_RSI + 8),local_e8,&local_f0);
  bVar1 = Status::ok((Status *)in_RDI);
  if (bVar1) {
    leveldb::log::Writer::Writer((Writer *)this_00,(WritableFile *)in_stack_fffffffffffffe78);
    std::__cxx11::string::string(local_138);
    VersionEdit::EncodeTo(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Slice::Slice((Slice *)this_00,in_stack_fffffffffffffe78);
    leveldb::log::Writer::AddRecord((Writer *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    Status::operator=((Status *)this_00,(Status *)in_stack_fffffffffffffe78);
    Status::~Status((Status *)this_00);
    bVar1 = Status::ok((Status *)in_RDI);
    if (bVar1) {
      (**(code **)(local_f0->state_ + 0x18))(local_158);
      Status::operator=((Status *)this_00,(Status *)in_stack_fffffffffffffe78);
      Status::~Status((Status *)this_00);
    }
    std::__cxx11::string::~string(local_138);
    leveldb::log::Writer::~Writer((Writer *)(local_138 + 0x20));
    rhs = local_f0;
    if (local_f0 != (Status *)0x0) {
      (**(code **)(local_f0->state_ + 8))();
      rhs = local_f0;
    }
    bVar1 = Status::ok((Status *)in_RDI);
    if (bVar1) {
      SetCurrentFile(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Status::operator=((Status *)this_00,rhs);
      Status::~Status((Status *)this_00);
    }
    else {
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))
                (&stack0xfffffffffffffe98,*(long **)(in_RSI + 8),local_e8);
      Status::~Status((Status *)this_00);
    }
  }
  std::__cxx11::string::~string(local_e8);
  VersionEdit::~VersionEdit(this_00);
  return (Status)(char *)this_00;
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}